

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::FileDescriptorTables::FindFieldByNumber
          (FileDescriptorTables *this,Descriptor *parent,int number)

{
  bool bVar1;
  reference ppFVar2;
  FileDescriptorTables *local_70;
  iterator local_58;
  pair<const_void_*,_int> local_48;
  undefined1 local_38 [8];
  const_iterator it;
  Descriptor *pDStack_20;
  int number_local;
  Descriptor *parent_local;
  FileDescriptorTables *this_local;
  
  it.inner_.field_1._4_4_ = number;
  pDStack_20 = parent;
  parent_local = (Descriptor *)this;
  if (((parent == (Descriptor *)0x0) || (number < 1)) ||
     ((int)(uint)parent->sequential_field_limit_ < number)) {
    std::pair<const_void_*,_int>::pair<const_google::protobuf::Descriptor_*&,_int_&,_true>
              (&local_48,&stack0xffffffffffffffe0,(int *)((long)&it.inner_.field_1 + 4));
    _local_38 = (iterator)
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::find<google::protobuf::(anonymous_namespace)::ParentNumberQuery>
                          (&(this->fields_by_number_).
                            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ,(key_arg<google::protobuf::(anonymous_namespace)::ParentNumberQuery> *)
                            &local_48);
    local_58 = (iterator)
               absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::end(&(this->fields_by_number_).
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    );
    bVar1 = absl::lts_20250127::container_internal::operator==
                      ((const_iterator *)local_38,(const_iterator *)&local_58);
    if (bVar1) {
      local_70 = (FileDescriptorTables *)0x0;
    }
    else {
      ppFVar2 = absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::const_iterator::operator*((const_iterator *)local_38);
      local_70 = (FileDescriptorTables *)*ppFVar2;
    }
    this_local = local_70;
  }
  else {
    this_local = (FileDescriptorTables *)Descriptor::field(parent,number + -1);
  }
  return (FieldDescriptor *)this_local;
}

Assistant:

inline const FieldDescriptor* FileDescriptorTables::FindFieldByNumber(
    const Descriptor* parent, int number) const {
  // If `number` is within the sequential range, just index into the parent
  // without doing a table lookup.
  if (parent != nullptr &&  //
      1 <= number && number <= parent->sequential_field_limit_) {
    return parent->field(number - 1);
  }

  auto it = fields_by_number_.find(ParentNumberQuery{{parent, number}});
  return it == fields_by_number_.end() ? nullptr : *it;
}